

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

long * __thiscall google::protobuf::RepeatedField<long>::elements(RepeatedField<long> *this)

{
  long *plVar1;
  RepeatedField<long> *in_RDI;
  
  plVar1 = unsafe_elements(in_RDI);
  return plVar1;
}

Assistant:

Element* elements() const {
    GOOGLE_DCHECK_GT(total_size_, 0);
    // Because of above pre-condition this cast is safe.
    return unsafe_elements();
  }